

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O1

ExprPtr __thiscall mathiu::impl::operator==(impl *this,ExprPtr *lhs,ExprPtr *rhs)

{
  long lVar1;
  bool bVar2;
  undefined8 *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  ExprPtr EVar5;
  _Tuple_impl<1UL,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
  local_40;
  uint local_20;
  
  bVar2 = equal(lhs,rhs);
  if (bVar2) {
    *(undefined8 *)this = true_;
    lVar1 = DAT_0025d670;
    *(long *)(this + 8) = DAT_0025d670;
    _Var4._M_pi = extraout_RDX;
    if (lVar1 != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
      }
    }
  }
  else {
    std::
    _Tuple_impl<1UL,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
    ::_Tuple_impl(&local_40,lhs,rhs);
    local_20 = 0;
    *(undefined8 *)this = 0;
    puVar3 = (undefined8 *)operator_new(0x50);
    puVar3[1] = 0x100000001;
    *puVar3 = &PTR___Sp_counted_ptr_inplace_00253718;
    puVar3[2] = local_40.super__Tuple_impl<2UL,_std::shared_ptr<const_mathiu::impl::Expr>_>.
                super__Head_base<2UL,_std::shared_ptr<const_mathiu::impl::Expr>,_false>._M_head_impl
                .super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    puVar3[3] = 0;
    puVar3[3] = local_40.super__Tuple_impl<2UL,_std::shared_ptr<const_mathiu::impl::Expr>_>.
                super__Head_base<2UL,_std::shared_ptr<const_mathiu::impl::Expr>,_false>._M_head_impl
                .super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
    puVar3[4] = local_40.super__Head_base<1UL,_std::shared_ptr<const_mathiu::impl::Expr>,_false>.
                _M_head_impl.
                super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    puVar3[5] = 0;
    puVar3[5] = local_40.super__Head_base<1UL,_std::shared_ptr<const_mathiu::impl::Expr>,_false>.
                _M_head_impl.
                super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi;
    _Var4._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)local_20;
    *(uint *)(puVar3 + 6) = local_20;
    *(undefined1 *)(puVar3 + 9) = 0xf;
    *(undefined8 **)(this + 8) = puVar3;
    *(undefined8 **)this = puVar3 + 2;
  }
  EVar5.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  EVar5.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ExprPtr)EVar5.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ExprPtr operator==(ExprPtr const &lhs, ExprPtr const &rhs)
    {
        if (equal(lhs, rhs))
        {
            return true_;
        }
        return makeSharedExprPtr(Relational{RelationalKind::kEQUAL, lhs, rhs});
    }